

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_qp.c
# Opt level: O0

char * cmime_qp_rm_charenc(char *line_in)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  int orig_ipos;
  int line_in_len;
  int opos;
  int ipos;
  char *line_out;
  char *line_in_local;
  
  orig_ipos = 0;
  sVar3 = strlen(line_in);
  sVar4 = strlen(line_in);
  pcVar5 = (char *)malloc(sVar4 + 1);
  for (line_in_len = 0; line_in_len < (int)sVar3; line_in_len = line_in_len + 1) {
    iVar1 = line_in_len;
    if (line_in[line_in_len] == '=') {
      if (line_in[line_in_len + 1] == '?') {
        iVar1 = line_in_len + 1;
        do {
          line_in_len = iVar1;
          iVar1 = line_in_len + 1;
        } while (line_in[line_in_len + 1] != '?');
        iVar1 = line_in_len + 2;
        iVar2 = tolower((int)line_in[iVar1]);
        if ((iVar2 == 0x71) || (iVar2 = tolower((int)line_in[iVar1]), iVar2 == 0x62)) {
          iVar1 = line_in_len + 4;
          do {
            line_in_len = iVar1;
            pcVar5[orig_ipos] = line_in[line_in_len];
            orig_ipos = orig_ipos + 1;
            iVar1 = line_in_len + 1;
          } while (line_in[line_in_len + 1] != '?');
          iVar1 = line_in_len + 2;
        }
      }
      else {
        pcVar5[orig_ipos] = line_in[line_in_len];
        orig_ipos = orig_ipos + 1;
      }
    }
    else {
      pcVar5[orig_ipos] = line_in[line_in_len];
      orig_ipos = orig_ipos + 1;
    }
    line_in_len = iVar1;
  }
  pcVar5[orig_ipos] = '\0';
  return pcVar5;
}

Assistant:

char *cmime_qp_rm_charenc(char *line_in) {
    char *line_out = NULL;
    int ipos = 0;
    int opos = 0;
    int line_in_len = strlen(line_in);

    line_out = malloc(strlen(line_in)+1*sizeof(char));
    for(ipos=0; ipos<line_in_len; ipos++) {
        if(line_in[ipos] == '=') {
            int orig_ipos = ipos;

            if(line_in[ipos+1] == '?') {
                ipos++;
                
                do {
                    ipos++;
                } while (line_in[ipos] != '?');

                ipos++;

                if(tolower(line_in[ipos]) == 'q' || tolower(line_in[ipos]) == 'b') {
                    ipos+=2;
                
                    do {
                        line_out[opos] = line_in[ipos];
                        opos++;
                        ipos++; 
                    } while (line_in[ipos] != '?');

                    ipos++;
                    continue;
                }
            } else {
                ipos = orig_ipos;
                line_out[opos] = line_in[ipos];
                opos++;
            }
        } else {    
            line_out[opos] = line_in[ipos];
            opos++;
        }
    }
    line_out[opos++] = '\0';
     return line_out;
}